

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O2

int cueify_full_toc_serialize(cueify_full_toc *t,uint8_t *buffer,size_t *size)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  ulong uVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  
  if (size == (size_t *)0x0 || t == (cueify_full_toc *)0x0) {
    return 3;
  }
  sVar2 = (((ushort)*(byte *)((long)t + 1) - (ushort)*(byte *)t) * 3 +
          ((ushort)*(byte *)((long)t + 3) - (ushort)*(byte *)((long)t + 2))) * 0xb;
  *size = (ulong)(ushort)(sVar2 + 0x30);
  if (buffer == (uint8_t *)0x0) {
    return 0;
  }
  uVar3 = sVar2 + 0x2e;
  *(ushort *)buffer = uVar3 * 0x100 | uVar3 >> 8;
  buffer[2] = *(uint8_t *)t;
  buffer[3] = *(uint8_t *)((long)t + 1);
  pbVar5 = buffer + 4;
  uVar4 = (ulong)*(byte *)((long)t + 2);
  pbVar6 = (byte *)((long)t + uVar4 * 9 + 0xc);
  bVar9 = 0;
  for (; uVar4 <= *(byte *)((long)t + 3); uVar4 = uVar4 + 1) {
    bVar1 = pbVar6[-8];
    bVar7 = bVar9;
    if (bVar1 != bVar9) {
      *pbVar5 = bVar1;
      pbVar5[1] = 0;
      lVar8 = (ulong)bVar1 * 0x21;
      bVar9 = *(char *)((long)t + lVar8 + 0x398) << 4;
      pbVar5[1] = bVar9;
      pbVar5[1] = *(byte *)((long)t + lVar8 + 0x399) & 0xf | bVar9;
      pbVar5[2] = 0;
      pbVar5[3] = 0xa0;
      pbVar5[4] = *(byte *)((long)t + lVar8 + 0x39a);
      pbVar5[5] = *(byte *)((long)t + lVar8 + 0x39b);
      pbVar5[6] = *(byte *)((long)t + lVar8 + 0x39c);
      pbVar5[7] = 0;
      pbVar5[8] = *(byte *)((long)t + lVar8 + 0x388);
      pbVar5[9] = *(byte *)((long)t + lVar8 + 0x38a);
      pbVar5[10] = 0;
      pbVar5[0xb] = bVar1;
      pbVar5[0xc] = 0;
      bVar9 = *(char *)((long)t + lVar8 + 0x3a1) << 4;
      pbVar5[0xc] = bVar9;
      pbVar5[0xc] = *(byte *)((long)t + lVar8 + 0x3a2) & 0xf | bVar9;
      pbVar5[0xd] = 0;
      pbVar5[0xe] = 0xa1;
      pbVar5[0xf] = *(byte *)((long)t + lVar8 + 0x3a3);
      pbVar5[0x10] = *(byte *)((long)t + lVar8 + 0x3a4);
      pbVar5[0x11] = *(byte *)((long)t + lVar8 + 0x3a5);
      pbVar5[0x12] = 0;
      pbVar5[0x13] = *(byte *)((long)t + lVar8 + 0x389);
      pbVar5[0x14] = 0;
      pbVar5[0x15] = 0;
      pbVar5[0x16] = bVar1;
      pbVar5[0x17] = 0;
      bVar9 = *(char *)((long)t + lVar8 + 0x38f) << 4;
      pbVar5[0x17] = bVar9;
      pbVar5[0x17] = *(byte *)((long)t + lVar8 + 0x390) & 0xf | bVar9;
      pbVar5[0x18] = 0;
      pbVar5[0x19] = 0xa2;
      pbVar5[0x1a] = *(byte *)((long)t + lVar8 + 0x391);
      pbVar5[0x1b] = *(byte *)((long)t + lVar8 + 0x392);
      pbVar5[0x1c] = *(byte *)((long)t + lVar8 + 0x393);
      pbVar5[0x1d] = 0;
      pbVar5[0x1e] = *(byte *)((long)t + lVar8 + 0x38b);
      pbVar5[0x1f] = *(byte *)((long)t + lVar8 + 0x38c);
      pbVar5[0x20] = *(byte *)((long)t + lVar8 + 0x38d);
      pbVar5 = pbVar5 + 0x21;
      bVar9 = bVar1;
      bVar7 = pbVar6[-8];
    }
    *pbVar5 = bVar7;
    pbVar5[1] = 0;
    bVar1 = pbVar6[-7];
    pbVar5[1] = bVar1 << 4;
    pbVar5[1] = pbVar6[-6] & 0xf | bVar1 << 4;
    pbVar5[2] = 0;
    pbVar5[3] = (byte)uVar4;
    pbVar5[4] = pbVar6[-5];
    pbVar5[5] = pbVar6[-4];
    pbVar5[6] = pbVar6[-3];
    pbVar5[7] = 0;
    pbVar5[8] = pbVar6[-2];
    pbVar5[9] = pbVar6[-1];
    pbVar5[10] = *pbVar6;
    pbVar5 = pbVar5 + 0xb;
    pbVar6 = pbVar6 + 9;
  }
  return 0;
}

Assistant:

int cueify_full_toc_serialize(cueify_full_toc *t, uint8_t *buffer,
			      size_t *size) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    uint16_t toc_length;
    uint8_t *bp;
    uint8_t cur_session = 0;
    int i;

    if (t == NULL || size == NULL) {
	return CUEIFY_ERR_BADARG;
    }

    toc_length =
	( (toc->last_track_number   - toc->first_track_number   + 1) +
	 ((toc->last_session_number - toc->first_session_number + 1) * 3)) * 11
	+ 4;
    *size = toc_length;
    if (buffer == NULL) {
	return CUEIFY_OK;
    } else if (*size < toc_length) {
	return CUEIFY_ERR_TOOSMALL;
    }

    /* TOC Data Length */
    toc_length -= 2;
    buffer[0] = toc_length >> 8;
    buffer[1] = toc_length & 0xFF;

    /* First Complete Session Number */
    buffer[2] = toc->first_session_number;
    /* Last Complete Session Number */
    buffer[3] = toc->last_session_number;

    /* TOC Track Descriptor(s) */
    bp = buffer + 4;
    for (i = toc->first_track_number; i <= toc->last_track_number; i++) {
	if (toc->tracks[i].session != cur_session) {
	    /* New session.  Add session-specific lines first. */
	    cur_session = toc->tracks[i].session;

	    /* POINT = 0xA0 */
	    /* Session Number */
	    *bp++ = cur_session;
	    /* ADR */
	    *bp = 0;
	    *bp |= toc->sessions[cur_session].pseudotracks[1].adr << 4;
	    /* CONTROL */
	    *bp++ |= toc->sessions[cur_session].pseudotracks[1].control & 0x0F;
	    /* TNO */
	    *bp++ = 0;
	    /* POINT */
	    *bp++ = 0xA0;
	    /* Min */
	    *bp++ = toc->sessions[cur_session].pseudotracks[1].atime.min;
	    /* Sec */
	    *bp++ = toc->sessions[cur_session].pseudotracks[1].atime.sec;
	    /* Frm */
	    *bp++ = toc->sessions[cur_session].pseudotracks[1].atime.frm;
	    /* Zero */
	    *bp++ = 0;
	    /* First Track Number */
	    *bp++ = toc->sessions[cur_session].first_track_number;
	    /* Disc Type */
	    *bp++ = toc->sessions[cur_session].session_type;
	    /* Reserved */
	    *bp++ = 0;

	    /* POINT = 0xA1 */
	    /* Session Number */
	    *bp++ = cur_session;
	    /* ADR */
	    *bp = 0;
	    *bp |= toc->sessions[cur_session].pseudotracks[2].adr << 4;
	    /* CONTROL */
	    *bp++ |= toc->sessions[cur_session].pseudotracks[2].control & 0x0F;
	    /* TNO */
	    *bp++ = 0;
	    /* POINT */
	    *bp++ = 0xA1;
	    /* Min */
	    *bp++ = toc->sessions[cur_session].pseudotracks[2].atime.min;
	    /* Sec */
	    *bp++ = toc->sessions[cur_session].pseudotracks[2].atime.sec;
	    /* Frm */
	    *bp++ = toc->sessions[cur_session].pseudotracks[2].atime.frm;
	    /* Zero */
	    *bp++ = 0;
	    /* First Track Number */
	    *bp++ = toc->sessions[cur_session].last_track_number;
	    /* Reserved */
	    *bp++ = 0;
	    *bp++ = 0;

	    /* POINT = 0xA2 */
	    /* Session Number */
	    *bp++ = cur_session;
	    /* ADR */
	    *bp = 0;
	    *bp |= toc->sessions[cur_session].pseudotracks[0].adr << 4;
	    /* CONTROL */
	    *bp++ |= toc->sessions[cur_session].pseudotracks[0].control & 0x0F;
	    /* TNO */
	    *bp++ = 0;
	    /* POINT */
	    *bp++ = 0xA2;
	    /* Min */
	    *bp++ = toc->sessions[cur_session].pseudotracks[0].atime.min;
	    /* Sec */
	    *bp++ = toc->sessions[cur_session].pseudotracks[0].atime.sec;
	    /* Frm */
	    *bp++ = toc->sessions[cur_session].pseudotracks[0].atime.frm;
	    /* Zero */
	    *bp++ = 0;
	    /* PMIN */
	    *bp++ = toc->sessions[cur_session].leadout.min;
	    /* PSEC */
	    *bp++ = toc->sessions[cur_session].leadout.sec;
	    /* PFRAME */
	    *bp++ = toc->sessions[cur_session].leadout.frm;
	}

	/* Session Number */
	*bp++ = toc->tracks[i].session;
	/* ADR */
	*bp = 0;
	*bp |= toc->tracks[i].adr << 4;
	/* CONTROL */
	*bp++ |= toc->tracks[i].control & 0x0F;
	/* TNO */
	*bp++ = 0;
	/* POINT */
	*bp++ = i;
	/* Min */
	*bp++ = toc->tracks[i].atime.min;
	/* Sec */
	*bp++ = toc->tracks[i].atime.sec;
	/* Frame */
	*bp++ = toc->tracks[i].atime.frm;
	/* Zero */
	*bp++ = 0;
	/* PMIN */
	*bp++ = toc->tracks[i].offset.min;
	/* PSEC */
	*bp++ = toc->tracks[i].offset.sec;
	/* PFRAME */
	*bp++ = toc->tracks[i].offset.frm;
    }

    return CUEIFY_OK;
}